

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainAppValidations.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  GradeBook gradeBook2;
  GradeBook gradeBook1;
  allocator local_69;
  string local_68;
  string local_48;
  GradeBook local_28;
  
  std::__cxx11::string::string
            ((string *)&local_48,"CS101 Introduction to Programming in C++",(allocator *)&local_68);
  GradeBook::GradeBook(&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_68,"CS102 C++ Data Structures",&local_69);
  GradeBook::GradeBook((GradeBook *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"gradeBook1 initial course name: ");
  GradeBook::getCourseName_abi_cxx11_(&local_68,&local_28);
  std::operator<<(poVar1,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"\ngradeBook2 initial course name: ");
  GradeBook::getCourseName_abi_cxx11_(&local_68,(GradeBook *)&local_48);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"CS101 C++ Programming",&local_69);
  GradeBook::setCourseName(&local_28,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"\ngradeBook1 course name: ");
  GradeBook::getCourseName_abi_cxx11_(&local_68,&local_28);
  std::operator<<(poVar1,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"\ngradeBook2 course name: ");
  GradeBook::getCourseName_abi_cxx11_(&local_68,(GradeBook *)&local_48);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {
    GradeBook gradeBook1("CS101 Introduction to Programming in C++");
    GradeBook gradeBook2("CS102 C++ Data Structures");

    // display each GradeBook's courseName
    std::cout << "gradeBook1 initial course name: "
              << gradeBook1.getCourseName();
    std::cout << "\ngradeBook2 initial course name: "
              << gradeBook2.getCourseName() << std::endl;

    // modify myGradeBook's courseName (with a valid length string)
    gradeBook1.setCourseName("CS101 C++ Programming");

    // display each GradeBook's courseName
    std::cout << "\ngradeBook1 course name: " << gradeBook1.getCourseName();
    std::cout << "\ngradeBook2 course name: " << gradeBook2.getCourseName()
              << std::endl;
    return 0;
}